

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int copy_ticket(ptls_encrypt_ticket_t *self,ptls_t *tls,ptls_buffer_t *dst,ptls_iovec_t src)

{
  int iVar1;
  size_t delta;
  
  delta = src.len;
  iVar1 = ptls_buffer_reserve(dst,delta);
  if (iVar1 == 0) {
    memcpy(dst->base + dst->off,src.base,delta);
    dst->off = dst->off + delta;
  }
  return iVar1;
}

Assistant:

static int copy_ticket(ptls_encrypt_ticket_t *self, ptls_t *tls, ptls_buffer_t *dst, ptls_iovec_t src)
{
    int ret;

    if ((ret = ptls_buffer_reserve(dst, src.len)) != 0)
        return ret;
    memcpy(dst->base + dst->off, src.base, src.len);
    dst->off += src.len;

    return 0;
}